

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O3

bool __thiscall cmCPackIFWRepository::PatchUpdatesXml(cmCPackIFWRepository *this)

{
  pointer pcVar1;
  bool bVar2;
  size_type sVar3;
  string updatesPatchXml;
  string updatesXml;
  cmXMLWriter xout;
  cmCPackeIFWUpdatesPatcher patcher;
  cmGeneratedFileStream fout;
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  cmXMLWriter local_2f8;
  cmXMLParser local_2a8;
  cmCPackIFWRepository *local_280;
  cmXMLWriter *local_278;
  undefined1 local_270;
  cmGeneratedFileStream local_268;
  
  sVar3 = (this->Directory)._M_string_length;
  if (sVar3 == 0) {
    if ((this->super_cmCPackIFWCommon).Generator == (cmCPackIFWGenerator *)0x0) {
      sVar3 = 0;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&this->Directory);
      sVar3 = (this->Directory)._M_string_length;
    }
  }
  pcVar1 = (this->Directory)._M_dataplus._M_p;
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char*>((string *)local_318,pcVar1,pcVar1 + sVar3);
  std::__cxx11::string::append((char *)local_318);
  pcVar1 = (this->Directory)._M_dataplus._M_p;
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_338,pcVar1,pcVar1 + (this->Directory)._M_string_length);
  std::__cxx11::string::append((char *)local_338);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_268,(char *)local_338[0],false,None);
  cmXMLWriter::cmXMLWriter(&local_2f8,(ostream *)&local_268,0);
  cmXMLWriter::StartDocument(&local_2f8,"UTF-8");
  cmCPackIFWCommon::WriteGeneratedByToStrim(&this->super_cmCPackIFWCommon,&local_2f8);
  cmXMLParser::cmXMLParser(&local_2a8);
  local_2a8._vptr_cmXMLParser = (_func_int **)&PTR__cmXMLParser_006e9ec8;
  local_270 = 0;
  local_280 = this;
  local_278 = &local_2f8;
  cmXMLParser::ParseFile(&local_2a8,(char *)local_318[0]);
  cmXMLParser::~cmXMLParser(&local_2a8);
  cmXMLWriter::EndDocument(&local_2f8);
  cmGeneratedFileStream::Close(&local_268);
  bVar2 = cmSystemTools::RenameFile((char *)local_338[0],(char *)local_318[0]);
  cmXMLWriter::~cmXMLWriter(&local_2f8);
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_268);
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  return bVar2;
}

Assistant:

bool cmCPackIFWRepository::PatchUpdatesXml()
{
  // Lazy directory initialization
  if (this->Directory.empty() && this->Generator) {
    this->Directory = this->Generator->toplevel;
  }

  // Filenames
  std::string updatesXml = this->Directory + "/repository/Updates.xml";
  std::string updatesPatchXml =
    this->Directory + "/repository/UpdatesPatch.xml";

  // Output stream
  cmGeneratedFileStream fout(updatesPatchXml.data());
  cmXMLWriter xout(fout);

  xout.StartDocument();

  this->WriteGeneratedByToStrim(xout);

  // Patch
  {
    cmCPackeIFWUpdatesPatcher patcher(this, xout);
    patcher.ParseFile(updatesXml.data());
  }

  xout.EndDocument();

  fout.Close();

  return cmSystemTools::RenameFile(updatesPatchXml.data(), updatesXml.data());
}